

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_svg_1.0.0.hpp
# Opt level: O1

bool __thiscall svg::Document::save(Document *this)

{
  int iVar1;
  ofstream ofs;
  string local_238;
  long local_218;
  filebuf local_210 [24];
  int aiStack_1f8 [54];
  ios_base local_120 [264];
  
  std::ofstream::ofstream(&local_218,(this->file_name)._M_dataplus._M_p,_S_out);
  iVar1 = *(int *)((long)aiStack_1f8 + *(long *)(local_218 + -0x18));
  if (iVar1 == 0) {
    toString_abi_cxx11_(&local_238,this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_218,local_238._M_dataplus._M_p,local_238._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    std::ofstream::close();
  }
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  return iVar1 == 0;
}

Assistant:

bool save() const
        {
            std::ofstream ofs(file_name.c_str());
            if (!ofs.good())
                return false;

            ofs << toString();
            ofs.close();
            return true;
        }